

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::MinMaxNBind<duckdb::LessThan>
          (duckdb *this,ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  PhysicalType PVar1;
  pointer puVar2;
  pointer pEVar3;
  ParameterNotResolvedException *this_00;
  reference pvVar4;
  code *pcVar5;
  code *pcVar6;
  code *pcVar7;
  code *pcVar8;
  code *pcVar9;
  code *pcVar10;
  pointer this_01;
  LogicalType local_40;
  
  this_01 = (arguments->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (arguments->
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while (this_01 != puVar2) {
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_01);
    this_01 = this_01 + 1;
    if ((pEVar3->return_type).id_ == UNKNOWN) {
      this_00 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
      ParameterNotResolvedException::ParameterNotResolvedException(this_00);
      __cxa_throw(this_00,&ParameterNotResolvedException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
  }
  pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar4);
  PVar1 = (pEVar3->return_type).physical_type_;
  switch(PVar1) {
  case INT32:
    pcVar5 = MinMaxNUpdate<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::LessThan>>;
    pcVar6 = MinMaxNOperation::
             Finalize<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::LessThan>>;
    pcVar7 = AggregateFunction::
             StateDestroy<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::LessThan>,duckdb::MinMaxNOperation>
    ;
    pcVar8 = AggregateFunction::
             StateCombine<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::LessThan>,duckdb::MinMaxNOperation>
    ;
    pcVar9 = AggregateFunction::
             StateInitialize<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
    ;
    pcVar10 = AggregateFunction::
              StateSize<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::LessThan>>;
    break;
  case INT64:
    pcVar5 = MinMaxNUpdate<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::LessThan>>;
    pcVar6 = MinMaxNOperation::
             Finalize<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::LessThan>>;
    pcVar7 = AggregateFunction::
             StateDestroy<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::LessThan>,duckdb::MinMaxNOperation>
    ;
    pcVar8 = AggregateFunction::
             StateCombine<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::LessThan>,duckdb::MinMaxNOperation>
    ;
    pcVar9 = AggregateFunction::
             StateInitialize<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
    ;
    pcVar10 = AggregateFunction::
              StateSize<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::LessThan>>;
    break;
  case FLOAT:
    pcVar5 = MinMaxNUpdate<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::LessThan>>;
    pcVar6 = MinMaxNOperation::
             Finalize<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::LessThan>>;
    pcVar7 = AggregateFunction::
             StateDestroy<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::LessThan>,duckdb::MinMaxNOperation>
    ;
    pcVar8 = AggregateFunction::
             StateCombine<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::LessThan>,duckdb::MinMaxNOperation>
    ;
    pcVar9 = AggregateFunction::
             StateInitialize<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
    ;
    pcVar10 = AggregateFunction::
              StateSize<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::LessThan>>;
    break;
  case DOUBLE:
    pcVar5 = MinMaxNUpdate<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::LessThan>>;
    pcVar6 = MinMaxNOperation::
             Finalize<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::LessThan>>;
    pcVar7 = AggregateFunction::
             StateDestroy<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::LessThan>,duckdb::MinMaxNOperation>
    ;
    pcVar8 = AggregateFunction::
             StateCombine<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::LessThan>,duckdb::MinMaxNOperation>
    ;
    pcVar9 = AggregateFunction::
             StateInitialize<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
    ;
    pcVar10 = AggregateFunction::
              StateSize<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::LessThan>>;
    break;
  default:
    if (PVar1 == VARCHAR) {
      pcVar5 = MinMaxNUpdate<duckdb::MinMaxNState<duckdb::MinMaxStringValue,duckdb::LessThan>>;
      pcVar6 = MinMaxNOperation::
               Finalize<duckdb::MinMaxNState<duckdb::MinMaxStringValue,duckdb::LessThan>>;
      pcVar7 = AggregateFunction::
               StateDestroy<duckdb::MinMaxNState<duckdb::MinMaxStringValue,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar8 = AggregateFunction::
               StateCombine<duckdb::MinMaxNState<duckdb::MinMaxStringValue,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar9 = AggregateFunction::
               StateInitialize<duckdb::MinMaxNState<duckdb::MinMaxStringValue,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar10 = AggregateFunction::
                StateSize<duckdb::MinMaxNState<duckdb::MinMaxStringValue,duckdb::LessThan>>;
      break;
    }
  case UINT64:
  case UINT64|UINT8:
    pcVar5 = MinMaxNUpdate<duckdb::MinMaxNState<duckdb::MinMaxFallbackValue,duckdb::LessThan>>;
    pcVar6 = MinMaxNOperation::
             Finalize<duckdb::MinMaxNState<duckdb::MinMaxFallbackValue,duckdb::LessThan>>;
    pcVar7 = AggregateFunction::
             StateDestroy<duckdb::MinMaxNState<duckdb::MinMaxFallbackValue,duckdb::LessThan>,duckdb::MinMaxNOperation>
    ;
    pcVar8 = AggregateFunction::
             StateCombine<duckdb::MinMaxNState<duckdb::MinMaxFallbackValue,duckdb::LessThan>,duckdb::MinMaxNOperation>
    ;
    pcVar9 = AggregateFunction::
             StateInitialize<duckdb::MinMaxNState<duckdb::MinMaxFallbackValue,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
    ;
    pcVar10 = AggregateFunction::
              StateSize<duckdb::MinMaxNState<duckdb::MinMaxFallbackValue,duckdb::LessThan>>;
  }
  function->state_size = pcVar10;
  function->initialize = pcVar9;
  function->combine = pcVar8;
  function->destructor = pcVar7;
  function->finalize = pcVar6;
  function->update = pcVar5;
  pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar4);
  LogicalType::LIST(&local_40,&pEVar3->return_type);
  LogicalType::operator=(&(function->super_BaseScalarFunction).return_type,&local_40);
  LogicalType::~LogicalType(&local_40);
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> MinMaxNBind(ClientContext &context, AggregateFunction &function,
                                     vector<unique_ptr<Expression>> &arguments) {

	for (auto &arg : arguments) {
		if (arg->return_type.id() == LogicalTypeId::UNKNOWN) {
			throw ParameterNotResolvedException();
		}
	}

	const auto val_type = arguments[0]->return_type.InternalType();

	// Specialize the function based on the input types
	SpecializeMinMaxNFunction<COMPARATOR>(val_type, function);

	function.return_type = LogicalType::LIST(arguments[0]->return_type);
	return nullptr;
}